

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O0

void dePoolArray_selfTest(void)

{
  deInt16 dVar1;
  deBool dVar2;
  int iVar3;
  deMemPool *pool_00;
  dePoolIntArray *pdVar4;
  dePoolInt16Array *arr_00;
  int local_24;
  int val;
  int i;
  dePoolInt16Array *arr16;
  dePoolIntArray *arr;
  deMemPool *pool;
  
  pool_00 = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  pdVar4 = dePoolIntArray_create(pool_00);
  arr_00 = dePoolInt16Array_create(pool_00);
  for (local_24 = 0; local_24 < 5000; local_24 = local_24 + 1) {
    deMemPool_alloc(pool_00,1);
    dePoolIntArray_pushBack(pdVar4,local_24);
    dePoolInt16Array_pushBack(arr_00,(deInt16)local_24);
  }
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (iVar3 = dePoolIntArray_getNumElements(pdVar4), iVar3 != 5000)) {
      deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xae);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (iVar3 = dePoolInt16Array_getNumElements(arr_00), iVar3 != 5000)) {
      deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xaf);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  for (local_24 = 0; local_24 < 5000; local_24 = local_24 + 1) {
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (iVar3 = dePoolIntArray_get(pdVar4,local_24), iVar3 != local_24)) {
        deAssertFail("dePoolIntArray_get(arr, i) == i",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xb2);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (dVar1 = dePoolInt16Array_get(arr_00,local_24), dVar1 != local_24)) {
        deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xb3);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
  }
  for (local_24 = 0; local_24 < 1000; local_24 = local_24 + 1) {
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (iVar3 = dePoolIntArray_popBack(pdVar4), iVar3 != 4999 - local_24)) {
        deAssertFail("dePoolIntArray_popBack(arr) == (4999 - i)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xb9);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (dVar1 = dePoolInt16Array_popBack(arr_00), (int)dVar1 != 4999 - local_24))
      {
        deAssertFail("dePoolInt16Array_popBack(arr16) == (4999 - i)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xba);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
  }
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (iVar3 = dePoolIntArray_getNumElements(pdVar4), iVar3 != 4000)) {
      deAssertFail("dePoolIntArray_getNumElements(arr) == 4000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xbd);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (iVar3 = dePoolInt16Array_getNumElements(arr_00), iVar3 != 4000)) {
      deAssertFail("dePoolInt16Array_getNumElements(arr16) == 4000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xbe);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  for (local_24 = 0; local_24 < 4000; local_24 = local_24 + 1) {
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (iVar3 = dePoolIntArray_get(pdVar4,local_24), iVar3 != local_24)) {
        deAssertFail("dePoolIntArray_get(arr, i) == i",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xc1);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (dVar1 = dePoolInt16Array_get(arr_00,local_24), dVar1 != local_24)) {
        deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xc2);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
  }
  dePoolIntArray_setSize(pdVar4,1000);
  dePoolInt16Array_setSize(arr_00,1000);
  for (local_24 = 1000; local_24 < 5000; local_24 = local_24 + 1) {
    dePoolIntArray_pushBack(pdVar4,local_24);
    dePoolInt16Array_pushBack(arr_00,(deInt16)local_24);
  }
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (iVar3 = dePoolIntArray_getNumElements(pdVar4), iVar3 != 5000)) {
      deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xce);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (iVar3 = dePoolInt16Array_getNumElements(arr_00), iVar3 != 5000)) {
      deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xcf);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  for (local_24 = 0; local_24 < 5000; local_24 = local_24 + 1) {
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (iVar3 = dePoolIntArray_get(pdVar4,local_24), iVar3 != local_24)) {
        deAssertFail("dePoolIntArray_get(arr, i) == i",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xd2);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (dVar1 = dePoolInt16Array_get(arr_00,local_24), dVar1 != local_24)) {
        deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xd3);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
  }
  pdVar4 = dePoolIntArray_create(pool_00);
  dePoolIntArray_setSize(pdVar4,0x5dc);
  dePoolIntArray_reserve(pdVar4,2000);
  for (local_24 = 0; local_24 < 0x5dc; local_24 = local_24 + 1) {
    dePoolIntArray_set(pdVar4,local_24,local_24);
  }
  for (; local_24 < 5000; local_24 = local_24 + 1) {
    dePoolIntArray_pushBack(pdVar4,local_24);
  }
  do {
    dVar2 = deGetFalse();
    if ((dVar2 != 0) || (iVar3 = dePoolIntArray_getNumElements(pdVar4), iVar3 != 5000)) {
      deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xdf);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  for (local_24 = 0; local_24 < 5000; local_24 = local_24 + 1) {
    iVar3 = dePoolIntArray_get(pdVar4,local_24);
    do {
      dVar2 = deGetFalse();
      if ((dVar2 != 0) || (iVar3 != local_24)) {
        deAssertFail("val == i",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xe3);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
  }
  deMemPool_destroy(pool_00);
  return;
}

Assistant:

void dePoolArray_selfTest (void)
{
	deMemPool*			pool	= deMemPool_createRoot(DE_NULL, 0);
	dePoolIntArray*		arr		= dePoolIntArray_create(pool);
	dePoolInt16Array*	arr16	= dePoolInt16Array_create(pool);
	int					i;

	/* Test pushBack(). */
	for (i = 0; i < 5000; i++)
	{
		/* Dummy alloc to try to break alignments. */
		deMemPool_alloc(pool, 1);

		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test popBack(). */
	for (i = 0; i < 1000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_popBack(arr) == (4999 - i));
		DE_TEST_ASSERT(dePoolInt16Array_popBack(arr16) == (4999 - i));
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 4000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 4000);
	for (i = 0; i < 4000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test setSize(). */
	dePoolIntArray_setSize(arr, 1000);
	dePoolInt16Array_setSize(arr16, 1000);
	for (i = 1000; i < 5000; i++)
	{
		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test set() and pushBack() with reserve(). */
	arr = dePoolIntArray_create(pool);
	dePoolIntArray_setSize(arr, 1500);
	dePoolIntArray_reserve(arr, 2000);
	for (i = 0; i < 1500; i++)
		dePoolIntArray_set(arr, i, i);
	for (; i < 5000; i++)
		dePoolIntArray_pushBack(arr, i);

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	for (i = 0; i < 5000; i++)
	{
		int val = dePoolIntArray_get(arr, i);
		DE_TEST_ASSERT(val == i);
	}

	deMemPool_destroy(pool);
}